

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O2

iterator * __thiscall
QPDFNumberTreeObjectHelper::end(iterator *__return_storage_ptr__,QPDFNumberTreeObjectHelper *this)

{
  undefined1 local_80 [112];
  
  NNTreeImpl::end((((this->m).
                    super___shared_ptr<QPDFNumberTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 );
  std::make_shared<NNTreeIterator,NNTreeIterator>((NNTreeIterator *)local_80);
  iterator::iterator(__return_storage_ptr__,(shared_ptr<NNTreeIterator> *)local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  NNTreeIterator::~NNTreeIterator((NNTreeIterator *)(local_80 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

QPDFNumberTreeObjectHelper::iterator
QPDFNumberTreeObjectHelper::end() const
{
    return {std::make_shared<NNTreeIterator>(m->impl->end())};
}